

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_frsqrt_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  float32 fVar7;
  float32 fVar8;
  float64 fVar9;
  float64 fVar10;
  long lVar11;
  float_status *status;
  uintptr_t unaff_retaddr;
  wr_t wx;
  float64 local_48 [3];
  
  lVar4 = (ulong)ws * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = float32_sqrt_mips(*(float32 *)
                                 ((long)(env->active_fpu).fpr + lVar11 * 4 + lVar4 + -0x228),pfVar2)
      ;
      fVar7 = float32_div_mips(0x3f800000,fVar7,pfVar2);
      *(float32 *)((long)local_48 + lVar11 * 4) = fVar7;
      fVar8 = float32_sqrt_mips(*(float32 *)
                                 ((long)(env->active_fpu).fpr + lVar11 * 4 + lVar4 + -0x228),pfVar2)
      ;
      iVar5 = 0;
      if ((fVar8 & 0x7fffffff) != 0x7f800000) {
        iVar5 = float32_is_quiet_nan_mips(fVar7,pfVar2);
        iVar5 = (uint)(iVar5 == 0) << 2;
      }
      uVar6 = update_msacsr(env,iVar5,(uint)((fVar7 & 0x7f800000) == 0 && (fVar7 & 0x7fffffff) != 0)
                           );
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
        fVar7 = float32_default_nan_mips(pfVar2);
        *(float32 *)((long)local_48 + lVar11 * 4) = fVar7 & 0xffffffc0 ^ 0x400000 | uVar6;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1b89,
                    "void helper_msa_frsqrt_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = float64_sqrt_mips(*(float64 *)
                                 ((long)(env->active_fpu).fpr + lVar11 * 8 + lVar4 + -0x228),pfVar2)
      ;
      fVar9 = float64_div_mips(0x3ff0000000000000,fVar9,pfVar2);
      local_48[lVar11] = fVar9;
      fVar10 = float64_sqrt_mips(*(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar11 * 8 + lVar4 + -0x228),pfVar2
                                );
      iVar5 = 0;
      if ((fVar10 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
        iVar5 = float64_is_quiet_nan_mips(fVar9,pfVar2);
        iVar5 = (uint)(iVar5 == 0) << 2;
      }
      uVar6 = update_msacsr(env,iVar5,
                            (uint)((fVar9 & 0x7ff0000000000000) == 0 &&
                                  (fVar9 & 0x7fffffffffffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar6) != 0) {
        fVar9 = float64_default_nan_mips(pfVar2);
        local_48[lVar11] = (long)(int)uVar6 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
    }
  }
  check_msacsr_cause(env,unaff_retaddr);
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_48[0];
  (&pfVar3->fd)[1] = local_48[1];
  return;
}

Assistant:

void helper_msa_frsqrt_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->w[i], float32_sqrt(pws->w[i],
                    &env->active_tc.msa_fp_status), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->d[i], float64_sqrt(pws->d[i],
                    &env->active_tc.msa_fp_status), 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}